

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

size_t __thiscall kws::Parser::FindArea(Parser *this,char *name,size_t startPos)

{
  string *psVar1;
  int iVar2;
  size_t pos;
  size_t sVar3;
  string local_50;
  
  psVar1 = &this->m_BufferNoComment;
  strlen(name);
  pos = std::__cxx11::string::find((char *)psVar1,(ulong)name,startPos);
  if (pos != 0xffffffffffffffff) {
    do {
      sVar3 = strlen(name);
      if ((psVar1->_M_dataplus)._M_p[sVar3 + pos] == ':') {
        return pos;
      }
      FindNextWord_abi_cxx11_(&local_50,this,pos);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (iVar2 == 0) {
        return pos;
      }
      strlen(name);
      pos = std::__cxx11::string::find((char *)psVar1,(ulong)name,pos + 1);
    } while (pos != 0xffffffffffffffff);
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t Parser::FindArea(const char* name,size_t startPos) const
{
  size_t pos = m_BufferNoComment.find(name, startPos);
  while(pos != std::string::npos)
    {
    if(m_BufferNoComment[pos+strlen(name)]==':' || this->FindNextWord(pos) == ":")
      {
      return pos;
      }
    pos = m_BufferNoComment.find(name, pos+1);
    }
  return std::string::npos;
}